

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O1

int __thiscall deqp::gles31::Functional::TextureTests::init(TextureTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestCaseGroup *node;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureFilteringTests::TextureFilteringTests
            ((TextureFilteringTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureFormatTests::TextureFormatTests
            ((TextureFormatTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureSpecificationTests::TextureSpecificationTests
            ((TextureSpecificationTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureMultisampleTests::TextureMultisampleTests
            ((TextureMultisampleTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureGatherTests::TextureGatherTests
            ((TextureGatherTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  node = createTextureBufferTests((this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)node);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureBorderClampTests::TextureBorderClampTests
            ((TextureBorderClampTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new TextureFilteringTests		(m_context));
		addChild(new TextureFormatTests			(m_context));
		addChild(new TextureSpecificationTests	(m_context));
		addChild(new TextureMultisampleTests	(m_context));
		addChild(new TextureGatherTests			(m_context));
		addChild(createTextureBufferTests		(m_context));
		addChild(new TextureBorderClampTests	(m_context));
	}